

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

int ipc_ep_init_dialer(void *arg,nng_url *url,nni_dialer *dialer)

{
  int iVar1;
  nni_sock *sock;
  
  sock = nni_dialer_sock(dialer);
  ipc_ep_init((ipc_ep *)arg,sock,ipc_ep_dial_cb);
  *(nni_dialer **)((long)arg + 0x50) = dialer;
  iVar1 = nng_stream_dialer_alloc_url((nng_stream_dialer **)((long)arg + 0x38),url);
  if (iVar1 == 0) {
    nni_dialer_add_stat(dialer,(nni_stat_item *)((long)arg + 0x420));
  }
  return iVar1;
}

Assistant:

static int
ipc_ep_init_dialer(void *arg, nng_url *url, nni_dialer *dialer)
{
	ipc_ep   *ep = arg;
	int       rv;
	nni_sock *sock = nni_dialer_sock(dialer);

	ipc_ep_init(ep, sock, ipc_ep_dial_cb);
	ep->ndialer = dialer;

	if ((rv = nng_stream_dialer_alloc_url(&ep->dialer, url)) != 0) {
		return (rv);
	}
#ifdef NNG_ENABLE_STATS
	nni_dialer_add_stat(dialer, &ep->st_rcv_max);
#endif
	return (0);
}